

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O1

void load_jpg_entry_helper(ALLEGRO_FILE *fp,load_jpg_entry_helper_data *data,int flags)

{
  char cVar1;
  int iVar2;
  JOCTET *pJVar3;
  ALLEGRO_BITMAP *pAVar4;
  long *plVar5;
  uchar *puVar6;
  undefined4 in_register_00000014;
  uchar *puVar7;
  long lVar8;
  uchar *out [1];
  jpeg_decompress_struct cinfo;
  my_err_mgr jerr;
  long local_438;
  undefined8 local_430;
  undefined8 *local_428;
  long local_408;
  int local_3a8;
  int local_3a4;
  uint local_39c;
  int local_388;
  code *local_1a0 [21];
  __jmp_buf_tag local_f8;
  
  data->error = false;
  local_430 = jpeg_std_error(local_1a0,data,CONCAT44(in_register_00000014,flags));
  local_1a0[0] = my_error_exit;
  iVar2 = _setjmp(&local_f8);
  if (iVar2 == 0) {
    pJVar3 = (JOCTET *)
             al_malloc_with_context
                       (0x1000,0xb8,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                        ,"load_jpg_entry_helper");
    data->buffer = pJVar3;
    if (pJVar3 == (JOCTET *)0x0) {
      data->error = true;
    }
    else {
      jpeg_CreateDecompress(&local_430,0x50,0x290);
      pJVar3 = data->buffer;
      if (local_408 == 0) {
        local_408 = (*(code *)*local_428)(&local_430,0,0x48);
      }
      *(code **)(local_408 + 0x10) = init_source;
      *(code **)(local_408 + 0x18) = fill_input_buffer;
      *(code **)(local_408 + 0x20) = skip_input_data;
      *(code **)(local_408 + 0x28) = jpeg_resync_to_restart;
      *(code **)(local_408 + 0x30) = term_source;
      *(undefined8 *)(local_408 + 8) = 0;
      *(JOCTET **)(local_408 + 0x38) = pJVar3;
      *(ALLEGRO_FILE **)(local_408 + 0x40) = fp;
      jpeg_read_header(&local_430,1);
      jpeg_start_decompress(&local_430);
      if ((local_39c & 0xfffffffd) == 1) {
        pAVar4 = (ALLEGRO_BITMAP *)al_create_bitmap(local_3a8,local_3a4);
        data->bmp = pAVar4;
        if (pAVar4 == (ALLEGRO_BITMAP *)0x0) {
          data->error = true;
          cVar1 = _al_trace_prefix("image",3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                   ,0xd1,"load_jpg_entry_helper");
          if (cVar1 != '\0') {
            _al_trace_suffix("%dx%d bitmap creation failed\n",local_3a8,local_3a4);
          }
        }
        else {
          plVar5 = (long *)al_lock_bitmap(pAVar4,0x13,2);
          if (local_39c == 1) {
            puVar6 = (uchar *)al_malloc_with_context
                                        ((long)local_3a8,0xf6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                         ,"load_jpg_entry_helper");
            data->row = puVar6;
            if (local_388 < local_3a4) {
              do {
                iVar2 = local_388;
                jpeg_read_scanlines(&local_430,&data->row,1);
                if (0 < local_3a8) {
                  puVar7 = (uchar *)((long)iVar2 * (long)*(int *)((long)plVar5 + 0xc) + *plVar5);
                  puVar6 = data->row;
                  lVar8 = 0;
                  do {
                    *puVar7 = puVar6[lVar8];
                    puVar7[1] = puVar6[lVar8];
                    puVar7[2] = puVar6[lVar8];
                    lVar8 = lVar8 + 1;
                    puVar7 = puVar7 + 3;
                  } while (local_3a8 != (int)lVar8);
                }
              } while (local_388 < local_3a4);
            }
          }
          else if ((local_39c == 3) && (local_388 < local_3a4)) {
            do {
              local_438 = (long)local_388 * (long)*(int *)((long)plVar5 + 0xc) + *plVar5;
              jpeg_read_scanlines(&local_430,&local_438,1);
            } while (local_388 < local_3a4);
          }
        }
      }
      else {
        data->error = true;
        cVar1 = _al_trace_prefix("image",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                 ,0xca,"load_jpg_entry_helper");
        if (cVar1 != '\0') {
          _al_trace_suffix("%d components makes no sense\n",local_39c);
        }
      }
    }
    jpeg_finish_decompress(&local_430);
  }
  else {
    data->error = true;
  }
  jpeg_destroy_decompress(&local_430);
  if (data->bmp != (ALLEGRO_BITMAP *)0x0) {
    cVar1 = al_is_bitmap_locked();
    if (cVar1 != '\0') {
      al_unlock_bitmap(data->bmp);
    }
    if (data->error == true) {
      al_destroy_bitmap(data->bmp);
      data->bmp = (ALLEGRO_BITMAP *)0x0;
    }
  }
  al_free_with_context
            (data->buffer,0x114,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  al_free_with_context
            (data->row,0x115,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  return;
}

Assistant:

static void load_jpg_entry_helper(ALLEGRO_FILE *fp,
   struct load_jpg_entry_helper_data *data, int flags)
{
   struct jpeg_decompress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;
   int w, h, s;

   /* ALLEGRO_NO_PREMULTIPLIED_ALPHA does not apply.
    * ALLEGRO_KEEP_INDEX does not apply.
    */
   (void)flags;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv) != 0) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_decompress(&cinfo);
   jpeg_packfile_src(&cinfo, fp, data->buffer);
   jpeg_read_header(&cinfo, true);
   jpeg_start_decompress(&cinfo);

   w = cinfo.output_width;
   h = cinfo.output_height;
   s = cinfo.output_components;

   /* Only one and three components make sense in a JPG file. */
   if (s != 1 && s != 3) {
      data->error = true;
      ALLEGRO_ERROR("%d components makes no sense\n", s);
      goto error;
   }

   data->bmp = al_create_bitmap(w, h);
   if (!data->bmp) {
      data->error = true;
      ALLEGRO_ERROR("%dx%d bitmap creation failed\n", w, h);
      goto error;
   }

   /* Allegro's pixel format is endian independent, so that in
    * ALLEGRO_PIXEL_FORMAT_RGB_888 the lower 8 bits always hold the Blue
    * component.  On a little endian system this is in byte 0.  On a big
    * endian system this is in byte 2.
    *
    * libjpeg expects byte 0 to hold the Red component, byte 1 to hold the
    * Green component, byte 2 to hold the Blue component.  Hence on little
    * endian systems we need the opposite format, ALLEGRO_PIXEL_FORMAT_BGR_888.
    */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
       ALLEGRO_LOCK_WRITEONLY);
#else
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
       ALLEGRO_LOCK_WRITEONLY);
#endif

   if (s == 3) {
      /* Colour. */
      int y;

      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         unsigned char *out[1];
         out[0] = ((unsigned char *)lock->data) + y * lock->pitch;
         jpeg_read_scanlines(&cinfo, (void *)out, 1);
      }
   }
   else if (s == 1) {
      /* Greyscale. */
      unsigned char *in;
      unsigned char *out;
      int x, y;

      data->row = al_malloc(w);
      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         jpeg_read_scanlines(&cinfo, (void *)&data->row, 1);
         in = data->row;
         out = ((unsigned char *)lock->data) + y * lock->pitch;
         for (x = 0; x < w; x++) {
            *out++ = *in;
            *out++ = *in;
            *out++ = *in;
            in++;
         }
      }
   }

 error:
   jpeg_finish_decompress(&cinfo);

 longjmp_error:
   jpeg_destroy_decompress(&cinfo);

   if (data->bmp) {
      if (al_is_bitmap_locked(data->bmp)) {
         al_unlock_bitmap(data->bmp);
      }
      if (data->error) {
         al_destroy_bitmap(data->bmp);
         data->bmp = NULL;
      }
   }

   al_free(data->buffer);
   al_free(data->row);
}